

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImRect *this;
  ImDrawCmd *pIVar4;
  ImDrawChannel *pIVar5;
  int iVar6;
  bool bVar7;
  float fVar8;
  ImVec4 IVar9;
  bool local_1e3;
  byte local_1d1;
  MergeGroup *local_1c0;
  ImDrawChannel *channel_1;
  undefined4 uStack_1a8;
  int n_2;
  undefined8 local_1a0;
  ImRect local_198;
  ImDrawChannel *local_188;
  ImDrawChannel *channel;
  int n_1;
  int n;
  ImRect merge_clip_rect;
  MergeGroup *merge_group_1;
  int merge_channels_count;
  int merge_group_n_1;
  ImRect host_rect;
  int remaining_count;
  ImBitArray<132> remaining_mask;
  ImDrawChannel *dst_tmp;
  int LEADING_DRAW_CHANNELS;
  ImRect local_110;
  ImRect *local_100;
  MergeGroup *merge_group;
  int merge_group_n;
  float content_max_x;
  ImDrawChannel *src_channel;
  int local_e0;
  int channel_no;
  int merge_group_sub_n;
  int merge_group_sub_count;
  ImGuiTableColumn *column;
  undefined1 local_c8 [4];
  int column_n;
  MergeGroup merge_groups [4];
  int merge_group_mask;
  bool has_freeze_h;
  bool has_freeze_v;
  ImDrawListSplitter *splitter;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  pIVar3 = GImGui;
  merge_groups[3].ChannelsMask.Storage[4]._3_1_ = '\0' < table->FreezeRowsCount;
  merge_groups[3].ChannelsMask.Storage[4]._2_1_ = '\0' < table->FreezeColumnsCount;
  merge_groups[3].ChannelsMask.Storage[3] = 0;
  local_1c0 = (MergeGroup *)local_c8;
  do {
    TableReorderDrawChannelsForMerge::MergeGroup::MergeGroup(local_1c0);
    local_1c0 = local_1c0 + 1;
  } while (local_1c0 != (MergeGroup *)(merge_groups[3].ChannelsMask.Storage + 3));
  memset(local_c8,0,0xa0);
  column._4_4_ = 0;
  do {
    if (table->ColumnsCount <= column._4_4_) {
      if (merge_groups[3].ChannelsMask.Storage[3] != 0) {
        ImVector<ImDrawChannel>::resize
                  (&pIVar3->DrawChannelsTempMergeBuffer,(table->DrawSplitter)._Count + -2);
        remaining_mask.Storage._12_8_ = (pIVar3->DrawChannelsTempMergeBuffer).Data;
        ImBitArray<132>::ImBitArray((ImBitArray<132> *)&host_rect.Max.y);
        ImBitArray<132>::ClearBits((ImBitArray<132> *)&host_rect.Max.y);
        ImBitArray<132>::SetBitRange
                  ((ImBitArray<132> *)&host_rect.Max.y,2,(table->DrawSplitter)._Count + -1);
        ImBitArray<132>::ClearBit
                  ((ImBitArray<132> *)&host_rect.Max.y,(uint)table->Bg1DrawChannelUnfrozen);
        bVar7 = true;
        if ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) != 0) {
          bVar7 = table->Bg1DrawChannelUnfrozen != '\x01';
        }
        if (!bVar7) {
          __assert_fail("has_freeze_v == false || table->Bg1DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG1_FROZEN"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                        ,0x26e9,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
        }
        iVar6 = 2;
        if ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) != 0) {
          iVar6 = 3;
        }
        host_rect.Max.x = (float)((table->DrawSplitter)._Count - iVar6);
        IVar2 = (table->HostClipRect).Min;
        host_rect.Min = (table->HostClipRect).Max;
        for (merge_group_1._4_4_ = 0; (int)merge_group_1._4_4_ < 4;
            merge_group_1._4_4_ = merge_group_1._4_4_ + 1) {
          merge_group_1._0_4_ = merge_groups[(int)merge_group_1._4_4_].ClipRect.Max.x;
          if (merge_group_1._0_4_ != 0.0) {
            merge_clip_rect.Max = (ImVec2)((long)local_c8 + (long)(int)merge_group_1._4_4_ * 0x28);
            _n_1 = *(ImVec2 *)merge_clip_rect.Max;
            merge_clip_rect.Min = merge_groups[(int)merge_group_1._4_4_].ClipRect.Min;
            if (((merge_group_1._4_4_ & 1) == 0) ||
               ((merge_groups[3].ChannelsMask.Storage[4]._2_1_ & 1) == 0)) {
              merge_channels_count = (int)IVar2.x;
              fVar8 = ImMin<float>((float)n_1,(float)merge_channels_count);
              n_1 = (int)fVar8;
            }
            if (((merge_group_1._4_4_ & 2) == 0) ||
               ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) == 0)) {
              merge_group_n_1 = (int)IVar2.y;
              fVar8 = ImMin<float>((float)n,(float)merge_group_n_1);
              n = (int)fVar8;
            }
            if ((merge_group_1._4_4_ & 1) != 0) {
              fVar8 = ImMax<float>(merge_clip_rect.Min.x,host_rect.Min.x);
              merge_clip_rect.Min.x = fVar8;
            }
            if (((merge_group_1._4_4_ & 2) != 0) && ((table->Flags & 0x40000U) == 0)) {
              fVar8 = ImMax<float>(merge_clip_rect.Min.y,host_rect.Min.y);
              merge_clip_rect.Min.y = fVar8;
            }
            host_rect.Max.x =
                 (float)((int)host_rect.Max.x - *(int *)((long)merge_clip_rect.Max + 0x10));
            for (channel._4_4_ = 0; channel._4_4_ < 5; channel._4_4_ = channel._4_4_ + 1) {
              (&host_rect.Max.y)[channel._4_4_] =
                   (float)((*(uint *)((long)merge_clip_rect.Max + 0x14 + (long)channel._4_4_ * 4) ^
                           0xffffffff) & (uint)(&host_rect.Max.y)[channel._4_4_]);
            }
            for (channel._0_4_ = 0;
                (int)channel < (table->DrawSplitter)._Count && merge_group_1._0_4_ != 0.0;
                channel._0_4_ = (int)channel + 1) {
              bVar7 = ImBitArray<132>::TestBit
                                ((ImBitArray<132> *)((long)merge_clip_rect.Max + 0x14),(int)channel)
              ;
              if (bVar7) {
                ImBitArray<132>::ClearBit
                          ((ImBitArray<132> *)((long)merge_clip_rect.Max + 0x14),(int)channel);
                merge_group_1._0_4_ = (float)((int)merge_group_1._0_4_ + -1);
                local_188 = ImVector<ImDrawChannel>::operator[]
                                      (&(table->DrawSplitter)._Channels,(int)channel);
                local_1e3 = false;
                if ((local_188->_CmdBuffer).Size == 1) {
                  pIVar4 = ImVector<ImDrawCmd>::operator[](&local_188->_CmdBuffer,0);
                  ImRect::ImRect(&local_198,&pIVar4->ClipRect);
                  local_1e3 = ImRect::Contains((ImRect *)&n_1,&local_198);
                }
                if (local_1e3 == false) {
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                                ,0x2714,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)"
                               );
                }
                IVar9 = ImRect::ToVec4((ImRect *)&n_1);
                pIVar4 = ImVector<ImDrawCmd>::operator[](&local_188->_CmdBuffer,0);
                _uStack_1a8 = IVar9._0_8_;
                (pIVar4->ClipRect).x = (float)uStack_1a8;
                (pIVar4->ClipRect).y = (float)n_2;
                local_1a0 = IVar9._8_8_;
                (pIVar4->ClipRect).z = (float)(undefined4)local_1a0;
                (pIVar4->ClipRect).w = (float)local_1a0._4_4_;
                *(undefined8 *)remaining_mask.Storage._12_8_ = *(undefined8 *)&local_188->_CmdBuffer
                ;
                *(ImDrawCmd **)(remaining_mask.Storage._12_8_ + 8) = (local_188->_CmdBuffer).Data;
                *(undefined8 *)(remaining_mask.Storage._12_8_ + 0x10) =
                     *(undefined8 *)&local_188->_IdxBuffer;
                *(uint **)(remaining_mask.Storage._12_8_ + 0x18) = (local_188->_IdxBuffer).Data;
                remaining_mask.Storage._12_8_ = remaining_mask.Storage._12_8_ + 0x20;
              }
            }
          }
          if ((merge_group_1._4_4_ == 1) &&
             ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) != 0)) {
            pIVar5 = ImVector<ImDrawChannel>::operator[]
                               (&(table->DrawSplitter)._Channels,(uint)table->Bg1DrawChannelUnfrozen
                               );
            *(undefined8 *)remaining_mask.Storage._12_8_ = *(undefined8 *)&pIVar5->_CmdBuffer;
            *(ImDrawCmd **)(remaining_mask.Storage._12_8_ + 8) = (pIVar5->_CmdBuffer).Data;
            *(undefined8 *)(remaining_mask.Storage._12_8_ + 0x10) =
                 *(undefined8 *)&pIVar5->_IdxBuffer;
            *(uint **)(remaining_mask.Storage._12_8_ + 0x18) = (pIVar5->_IdxBuffer).Data;
            remaining_mask.Storage._12_8_ = remaining_mask.Storage._12_8_ + 0x20;
          }
        }
        for (channel_1._4_4_ = 0;
            channel_1._4_4_ < (table->DrawSplitter)._Count && host_rect.Max.x != 0.0;
            channel_1._4_4_ = channel_1._4_4_ + 1) {
          bVar7 = ImBitArray<132>::TestBit((ImBitArray<132> *)&host_rect.Max.y,channel_1._4_4_);
          if (bVar7) {
            pIVar5 = ImVector<ImDrawChannel>::operator[]
                               (&(table->DrawSplitter)._Channels,channel_1._4_4_);
            *(undefined8 *)remaining_mask.Storage._12_8_ = *(undefined8 *)&pIVar5->_CmdBuffer;
            *(ImDrawCmd **)(remaining_mask.Storage._12_8_ + 8) = (pIVar5->_CmdBuffer).Data;
            *(undefined8 *)(remaining_mask.Storage._12_8_ + 0x10) =
                 *(undefined8 *)&pIVar5->_IdxBuffer;
            *(uint **)(remaining_mask.Storage._12_8_ + 0x18) = (pIVar5->_IdxBuffer).Data;
            host_rect.Max.x = (float)((int)host_rect.Max.x + -1);
            remaining_mask.Storage._12_8_ = remaining_mask.Storage._12_8_ + 0x20;
          }
        }
        if ((ImDrawChannel *)remaining_mask.Storage._12_8_ !=
            (pIVar3->DrawChannelsTempMergeBuffer).Data + (pIVar3->DrawChannelsTempMergeBuffer).Size)
        {
          __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                        ,0x2728,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
        }
        memcpy((table->DrawSplitter)._Channels.Data + 2,(pIVar3->DrawChannelsTempMergeBuffer).Data,
               (long)((table->DrawSplitter)._Count + -2) << 5);
      }
      return;
    }
    if ((table->VisibleUnclippedMaskByIndex & 1L << ((byte)column._4_4_ & 0x3f)) != 0) {
      _merge_group_sub_n = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
      channel_no = 1;
      if ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) != 0) {
        channel_no = 2;
      }
      for (local_e0 = 0; local_e0 < channel_no; local_e0 = local_e0 + 1) {
        if (local_e0 == 0) {
          local_1d1 = _merge_group_sub_n->DrawChannelFrozen;
        }
        else {
          local_1d1 = _merge_group_sub_n->DrawChannelUnfrozen;
        }
        src_channel._4_4_ = (uint)local_1d1;
        _merge_group_n =
             ImVector<ImDrawChannel>::operator[](&(table->DrawSplitter)._Channels,src_channel._4_4_)
        ;
        if ((0 < (_merge_group_n->_CmdBuffer).Size) &&
           (pIVar4 = ImVector<ImDrawCmd>::back(&_merge_group_n->_CmdBuffer), pIVar4->ElemCount == 0)
           ) {
          ImVector<ImDrawCmd>::pop_back(&_merge_group_n->_CmdBuffer);
        }
        if ((_merge_group_n->_CmdBuffer).Size == 1) {
          if ((_merge_group_sub_n->Flags & 0x100U) == 0) {
            if ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) == 0) {
              merge_group._4_4_ =
                   ImMax<float>(_merge_group_sub_n->ContentMaxXUnfrozen,
                                _merge_group_sub_n->ContentMaxXHeadersUsed);
            }
            else if (local_e0 == 0) {
              merge_group._4_4_ =
                   ImMax<float>(_merge_group_sub_n->ContentMaxXFrozen,
                                _merge_group_sub_n->ContentMaxXHeadersUsed);
            }
            else {
              merge_group._4_4_ = _merge_group_sub_n->ContentMaxXUnfrozen;
            }
            pIVar1 = &(_merge_group_sub_n->ClipRect).Max;
            if (pIVar1->x <= merge_group._4_4_ && merge_group._4_4_ != pIVar1->x) goto LAB_00465959;
          }
          bVar7 = false;
          if ((merge_groups[3].ChannelsMask.Storage[4]._2_1_ & 1) != 0) {
            bVar7 = column._4_4_ < table->FreezeColumnsCount;
          }
          iVar6 = 2;
          if ((merge_groups[3].ChannelsMask.Storage[4]._3_1_ & 1) != 0 && local_e0 == 0) {
            iVar6 = 0;
          }
          merge_group._0_4_ = (uint)!bVar7 + iVar6;
          if (0x83 < (int)src_channel._4_4_) {
            __assert_fail("channel_no < (4 + 64 * 2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                          ,0x26bd,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
          }
          local_100 = (ImRect *)(local_c8 + (long)(int)merge_group * 0x28);
          if (merge_groups[(int)merge_group].ClipRect.Max.x == 0.0) {
            ImRect::ImRect(&local_110,3.4028235e+38,3.4028235e+38,-3.4028235e+38,-3.4028235e+38);
            local_100->Min = local_110.Min;
            local_100->Max = local_110.Max;
          }
          ImBitArray<132>::SetBit((ImBitArray<132> *)&local_100[1].Min.y,src_channel._4_4_);
          this = local_100;
          local_100[1].Min.x = (float)((int)local_100[1].Min.x + 1);
          pIVar4 = ImVector<ImDrawCmd>::operator[](&_merge_group_n->_CmdBuffer,0);
          ImRect::ImRect((ImRect *)&stack0xfffffffffffffee0,&pIVar4->ClipRect);
          ImRect::Add(this,(ImRect *)&stack0xfffffffffffffee0);
          merge_groups[3].ChannelsMask.Storage[3] =
               1 << ((byte)(int)merge_group & 0x1f) | merge_groups[3].ChannelsMask.Storage[3];
        }
LAB_00465959:
      }
      _merge_group_sub_n->DrawChannelCurrent = 0xff;
    }
    column._4_4_ = column._4_4_ + 1;
  } while( true );
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImU8)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0) and 1 (Bg1 frozen) from the shuffling since they won't move - see channels allocation in TableUpdateDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count - 1);
        remaining_mask.ClearBit(table->Bg1DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg1DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG1_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg1DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0 and Bg1 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg1DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}